

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O3

code_point booster::locale::utf::utf_traits<char,1>::decode<char_const*>(char **p,char *e)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uchar c;
  
  pbVar3 = (byte *)*p;
  if (pbVar3 == (byte *)e) {
    return 0xfffffffe;
  }
  pbVar1 = pbVar3 + 1;
  *p = (char *)pbVar1;
  bVar2 = *pbVar3;
  if ((char)bVar2 < '\0') {
    if (0xc1 < bVar2) {
      if (bVar2 < 0xe0) {
        if (pbVar1 == (byte *)e) {
          return 0xfffffffe;
        }
        *p = (char *)(pbVar3 + 2);
      }
      else if (bVar2 < 0xf0) {
        if (pbVar1 == (byte *)e) {
          return 0xfffffffe;
        }
        *p = (char *)(pbVar3 + 2);
      }
      else if (bVar2 < 0xf5) {
        if (pbVar1 == (byte *)e) {
          return 0xfffffffe;
        }
        *p = (char *)(pbVar3 + 2);
      }
    }
    return 0xffffffff;
  }
  return (uint)bVar2;
}

Assistant:

static code_point decode(Iterator &p,Iterator e)
        {
            if(BOOSTER_LOCALE_UNLIKELY(p==e))
                return incomplete;

            unsigned char lead = *p++;

            // First byte is fully validated here
            int trail_size = trail_length(lead);

            if(BOOSTER_LOCALE_UNLIKELY(trail_size < 0))
                return illegal;

            //
            // Ok as only ASCII may be of size = 0
            // also optimize for ASCII text
            //
            if(trail_size == 0)
                return lead;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            // Read the rest
            unsigned char tmp;
            switch(trail_size) {
            case 3:
                if(BOOSTER_LOCALE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 2:
                if(BOOSTER_LOCALE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 1:
                if(BOOSTER_LOCALE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            }

            // Check code point validity: no surrogates and
            // valid range
            if(BOOSTER_LOCALE_UNLIKELY(!is_valid_codepoint(c)))
                return illegal;

            // make sure it is the most compact representation
            if(BOOSTER_LOCALE_UNLIKELY(width(c)!=trail_size + 1))
                return illegal;

            return c;

        }